

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatOrderH.c
# Opt level: O3

void Msat_OrderClean(Msat_Order_t *p,Msat_IntVec_t *vCone)

{
  Msat_IntVec_t *pMVar1;
  int *piVar2;
  Msat_IntVec_t *pMVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  
  pMVar1 = p->vIndex;
  if (0 < pMVar1->nSize) {
    piVar2 = pMVar1->pArray;
    lVar5 = 0;
    do {
      piVar2[lVar5] = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < pMVar1->nSize);
  }
  iVar6 = vCone->nSize;
  pMVar3 = p->vHeap;
  if (0 < iVar6) {
    lVar5 = 1;
    do {
      if (pMVar3->nCap <= lVar5) {
        __assert_fail("i+1 < p->vHeap->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatOrderH.c"
                      ,0x7f,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
      }
      iVar6 = vCone->pArray[lVar5 + -1];
      pMVar3->pArray[lVar5] = iVar6;
      if (pMVar1->nSize <= iVar6) {
        __assert_fail("vCone->pArray[i] < p->vIndex->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatOrderH.c"
                      ,0x82,"void Msat_OrderClean(Msat_Order_t *, Msat_IntVec_t *)");
      }
      pMVar1->pArray[iVar6] = (int)lVar5;
      iVar6 = vCone->nSize;
      bVar4 = lVar5 < iVar6;
      lVar5 = lVar5 + 1;
    } while (bVar4);
  }
  pMVar3->nSize = iVar6 + 1;
  return;
}

Assistant:

void Msat_OrderClean( Msat_Order_t * p, Msat_IntVec_t * vCone )
{
    int i;
    for ( i = 0; i < p->vIndex->nSize; i++ )
        p->vIndex->pArray[i] = 0;
    for ( i = 0; i < vCone->nSize; i++ )
    {
        assert( i+1 < p->vHeap->nCap );
        p->vHeap->pArray[i+1] = vCone->pArray[i];

        assert( vCone->pArray[i] < p->vIndex->nSize );
        p->vIndex->pArray[vCone->pArray[i]] = i+1;
    }
    p->vHeap->nSize = vCone->nSize + 1;
}